

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdGeom.hh
# Opt level: O0

void __thiscall tinyusdz::GeomPrimvar::GeomPrimvar(GeomPrimvar *this)

{
  GeomPrimvar *this_local;
  
  ::std::__cxx11::string::string((string *)this);
  this->_has_value = false;
  Attribute::Attribute(&this->_attr);
  ::std::vector<int,_std::allocator<int>_>::vector(&this->_indices);
  TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::TypedTimeSamples(&this->_ts_indices);
  nonstd::optional_lite::optional<int>::optional(&this->_unauthoredValuesIndex);
  nonstd::optional_lite::optional<unsigned_int>::optional(&this->_elementSize);
  nonstd::optional_lite::optional<tinyusdz::Interpolation>::optional(&this->_interpolation);
  return;
}

Assistant:

GeomPrimvar() : _has_value(false) {
  }